

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_subquery.cpp
# Opt level: O3

bool duckdb::PerformDuplicateElimination
               (Binder *binder,vector<duckdb::CorrelatedColumnInfo,_true> *correlated_columns)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pCVar2;
  bool bVar3;
  ClientConfig *pCVar4;
  idx_t iVar5;
  vector<duckdb::CorrelatedColumnInfo,_true> *__range1;
  CorrelatedColumnInfo *col;
  pointer pCVar6;
  CorrelatedColumnInfo info;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  LogicalType local_98;
  value_type local_80;
  
  pCVar4 = ClientConfig::GetConfig(binder->context);
  if (pCVar4->enable_optimizer == true) {
    pCVar2 = (correlated_columns->
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ).
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pCVar6 = (correlated_columns->
                  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                  ).
                  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start; pCVar6 != pCVar2; pCVar6 = pCVar6 + 1)
    {
      bVar3 = PerformDelimOnType(&pCVar6->type);
      if (!bVar3) {
        iVar5 = Binder::GenerateTableIndex(binder);
        LogicalType::LogicalType(&local_98,BIGINT);
        local_b8 = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"delim_index","");
        local_80.binding.column_index = 0;
        local_80.binding.table_index = iVar5;
        LogicalType::LogicalType(&local_80.type,&local_98);
        paVar1 = &local_80.name.field_2;
        if (local_b8 == &local_a8) {
          local_80.name.field_2._8_8_ = local_a8._8_8_;
          local_80.name._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_80.name._M_dataplus._M_p = (pointer)local_b8;
        }
        local_80.name._M_string_length = local_b0;
        local_b0 = 0;
        local_a8._M_local_buf[0] = '\0';
        local_80.depth = 0;
        local_b8 = &local_a8;
        LogicalType::~LogicalType(&local_98);
        ::std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
        _M_insert_rval(&correlated_columns->
                        super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                       ,(correlated_columns->
                        super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                        ).
                        super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.name._M_dataplus._M_p != paVar1) {
          operator_delete(local_80.name._M_dataplus._M_p);
        }
        LogicalType::~LogicalType(&local_80.type);
        return false;
      }
    }
  }
  return true;
}

Assistant:

static bool PerformDuplicateElimination(Binder &binder, vector<CorrelatedColumnInfo> &correlated_columns) {
	if (!ClientConfig::GetConfig(binder.context).enable_optimizer) {
		// if optimizations are disabled we always do a delim join
		return true;
	}
	bool perform_delim = true;
	for (auto &col : correlated_columns) {
		if (!PerformDelimOnType(col.type)) {
			perform_delim = false;
			break;
		}
	}
	if (perform_delim) {
		return true;
	}
	auto binding = ColumnBinding(binder.GenerateTableIndex(), 0);
	auto type = LogicalType::BIGINT;
	auto name = "delim_index";
	CorrelatedColumnInfo info(binding, type, name, 0);
	correlated_columns.insert(correlated_columns.begin(), std::move(info));
	return false;
}